

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O0

void Ssw_ManUpdateEquivs(Ssw_Man_t *p,Aig_Man_t *pAig,int fVerbose)

{
  int iVar1;
  int iVar2;
  int nNodes;
  void **ppvVar3;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj_00;
  int local_44;
  int local_40;
  int nRemoved;
  int nTotal;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t **pArray;
  Vec_Ptr_t *vCones;
  int fVerbose_local;
  Aig_Man_t *pAig_local;
  Ssw_Man_t *p_local;
  
  local_40 = 0;
  local_44 = 0;
  ppvVar3 = Vec_PtrArray(pAig->vCos);
  iVar1 = Saig_ManPoNum(pAig);
  iVar2 = Saig_ManConstrNum(pAig);
  nNodes = Saig_ManConstrNum(pAig);
  p_00 = Aig_ManDfsNodes(pAig,(Aig_Obj_t **)(ppvVar3 + (iVar1 - iVar2)),nNodes);
  for (nRemoved = 0; iVar1 = Vec_PtrSize(pAig->vObjs), nRemoved < iVar1; nRemoved = nRemoved + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,nRemoved);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       ((iVar1 = Aig_ObjIsCi(pObj_00), iVar1 != 0 || (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0))))
    {
      if (pAig->pReprs[nRemoved] != (Aig_Obj_t *)0x0) {
        local_40 = local_40 + 1;
      }
      iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj_00);
      if ((((iVar1 != 0) && (pAig->pReprs[nRemoved] != (Aig_Obj_t *)0x0)) &&
          (p->pPars->fConstrs != 0)) && (p->pPars->fMergeFull == 0)) {
        pAig->pReprs[nRemoved] = (Aig_Obj_t *)0x0;
        local_44 = local_44 + 1;
      }
    }
  }
  iVar1 = Aig_ManCiNum(pAig);
  iVar2 = Aig_ManNodeNum(pAig);
  p->nConesTotal = iVar1 + iVar2;
  iVar1 = Vec_PtrSize(p_00);
  p->nConesConstr = iVar1;
  p->nEquivsTotal = local_40;
  p->nEquivsConstr = local_44;
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Ssw_ManUpdateEquivs( Ssw_Man_t * p, Aig_Man_t * pAig, int fVerbose )
{
    Vec_Ptr_t * vCones;
    Aig_Obj_t ** pArray;
    Aig_Obj_t * pObj;
    int i, nTotal = 0, nRemoved = 0;
    // collect the nodes in the cone of constraints
    pArray  = (Aig_Obj_t **)Vec_PtrArray(pAig->vCos);
    pArray += Saig_ManPoNum(pAig) - Saig_ManConstrNum(pAig);
    vCones  = Aig_ManDfsNodes( pAig, pArray, Saig_ManConstrNum(pAig) );
    // remove all the node that are equiv to something and are in the cones
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( pAig->pReprs[i] != NULL )
            nTotal++;
        if ( !Aig_ObjIsTravIdCurrent(pAig, pObj) )
            continue;
        if ( pAig->pReprs[i] )
        {
            if ( p->pPars->fConstrs && !p->pPars->fMergeFull )
            {
                pAig->pReprs[i] = NULL;
                nRemoved++;
            }
        }
    }
    // collect statistics    
    p->nConesTotal   = Aig_ManCiNum(pAig) + Aig_ManNodeNum(pAig);
    p->nConesConstr  = Vec_PtrSize(vCones);
    p->nEquivsTotal  = nTotal;
    p->nEquivsConstr = nRemoved;
    Vec_PtrFree( vCones );
}